

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

int header_set_ttl(HEADER_HANDLE header,milliseconds ttl_value)

{
  int iVar1;
  AMQP_VALUE item_value;
  AMQP_VALUE ttl_amqp_value;
  HEADER_INSTANCE *header_instance;
  int result;
  milliseconds ttl_value_local;
  HEADER_HANDLE header_local;
  
  if (header == (HEADER_HANDLE)0x0) {
    header_instance._0_4_ = 0x3aae;
  }
  else {
    item_value = amqpvalue_create_milliseconds(ttl_value);
    if (item_value == (AMQP_VALUE)0x0) {
      header_instance._0_4_ = 0x3ab6;
    }
    else {
      iVar1 = amqpvalue_set_composite_item(header->composite_value,2,item_value);
      if (iVar1 == 0) {
        header_instance._0_4_ = 0;
      }
      else {
        header_instance._0_4_ = 0x3abc;
      }
      amqpvalue_destroy(item_value);
    }
  }
  return (int)header_instance;
}

Assistant:

int header_set_ttl(HEADER_HANDLE header, milliseconds ttl_value)
{
    int result;

    if (header == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        HEADER_INSTANCE* header_instance = (HEADER_INSTANCE*)header;
        AMQP_VALUE ttl_amqp_value = amqpvalue_create_milliseconds(ttl_value);
        if (ttl_amqp_value == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (amqpvalue_set_composite_item(header_instance->composite_value, 2, ttl_amqp_value) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            amqpvalue_destroy(ttl_amqp_value);
        }
    }

    return result;
}